

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestoffsetAccessors::runTestCase(TestValueTestoffsetAccessors *this)

{
  size_t sVar1;
  Value *this_00;
  TestResult *this_01;
  char *file;
  char *expr;
  Value z;
  Value y;
  Value x;
  Value *in_stack_ffffffffffffff08;
  Value *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  Value *in_stack_ffffffffffffff20;
  uint uVar2;
  char *in_stack_ffffffffffffff28;
  TestResult *in_stack_ffffffffffffff30;
  Value *in_stack_ffffffffffffff88;
  Value *in_stack_ffffffffffffff90;
  Value local_68;
  Value local_30;
  
  Json::Value::Value(in_stack_ffffffffffffff20,(ValueType)((ulong)in_stack_ffffffffffffff18 >> 0x20)
                    );
  sVar1 = Json::Value::getOffsetStart(&local_30);
  if (sVar1 != 0) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  sVar1 = Json::Value::getOffsetLimit(&local_30);
  if (sVar1 != 0) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  Json::Value::setOffsetStart(&local_30,10);
  Json::Value::setOffsetLimit(&local_30,0x14);
  sVar1 = Json::Value::getOffsetStart(&local_30);
  if (sVar1 != 10) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  this_00 = (Value *)Json::Value::getOffsetLimit(&local_30);
  if (this_00 != (Value *)0x14) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  Json::Value::Value(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar1 = Json::Value::getOffsetStart(&local_68);
  if (sVar1 != 10) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  }
  this_01 = (TestResult *)Json::Value::getOffsetLimit(&local_68);
  if (this_01 != (TestResult *)0x14) {
    JsonTest::TestResult::addFailure
              (this_01,in_stack_ffffffffffffff28,(uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),
               in_stack_ffffffffffffff18);
  }
  Json::Value::Value(in_stack_ffffffffffffff20,(ValueType)((ulong)in_stack_ffffffffffffff18 >> 0x20)
                    );
  uVar2 = (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  Json::Value::swap(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  file = (char *)Json::Value::getOffsetStart((Value *)&stack0xffffffffffffff70);
  if (file != (char *)0xa) {
    JsonTest::TestResult::addFailure(this_01,file,uVar2,in_stack_ffffffffffffff18);
  }
  sVar1 = Json::Value::getOffsetLimit((Value *)&stack0xffffffffffffff70);
  if (sVar1 != 0x14) {
    JsonTest::TestResult::addFailure(this_01,file,(uint)(sVar1 >> 0x20),in_stack_ffffffffffffff18);
  }
  uVar2 = (uint)(sVar1 >> 0x20);
  expr = (char *)Json::Value::getOffsetStart(&local_68);
  if (expr != (char *)0x0) {
    JsonTest::TestResult::addFailure(this_01,file,uVar2,expr);
  }
  sVar1 = Json::Value::getOffsetLimit(&local_68);
  if (sVar1 != 0) {
    JsonTest::TestResult::addFailure(this_01,file,uVar2,expr);
  }
  Json::Value::~Value(this_00);
  Json::Value::~Value(this_00);
  Json::Value::~Value(this_00);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, offsetAccessors) {
  Json::Value x;
  JSONTEST_ASSERT(x.getOffsetStart() == 0);
  JSONTEST_ASSERT(x.getOffsetLimit() == 0);
  x.setOffsetStart(10);
  x.setOffsetLimit(20);
  JSONTEST_ASSERT(x.getOffsetStart() == 10);
  JSONTEST_ASSERT(x.getOffsetLimit() == 20);
  Json::Value y(x);
  JSONTEST_ASSERT(y.getOffsetStart() == 10);
  JSONTEST_ASSERT(y.getOffsetLimit() == 20);
  Json::Value z;
  z.swap(y);
  JSONTEST_ASSERT(z.getOffsetStart() == 10);
  JSONTEST_ASSERT(z.getOffsetLimit() == 20);
  JSONTEST_ASSERT(y.getOffsetStart() == 0);
  JSONTEST_ASSERT(y.getOffsetLimit() == 0);
}